

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execLink<(moira::Instr)68,(moira::Mode)12,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  u32 uVar3;
  int delay;
  Moira *in_RDI;
  AEStackFrame frame;
  i16 disp;
  int ax;
  u32 sp;
  u16 ird;
  u32 in_stack_ffffffffffffffc8;
  u32 in_stack_ffffffffffffffcc;
  undefined1 in_stack_ffffffffffffffd8 [16];
  
  getIRD(in_RDI);
  uVar2 = getSP(in_RDI);
  uVar3 = readI<(moira::Size)2>(in_RDI);
  bVar1 = misaligned<(moira::Size)4>(in_RDI,uVar2 - 4);
  if (bVar1) {
    writeA<(moira::Size)4>(in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    uVar2 = getPC(in_RDI);
    delay = uVar2 + 2;
    getSR((Moira *)0x27576f);
    frame = makeFrame<40ul>(in_stack_ffffffffffffffd8._8_8_,in_stack_ffffffffffffffd8._4_4_,
                            in_stack_ffffffffffffffd8._0_4_,(u16)((ulong)in_RDI >> 0x30),
                            (u16)((ulong)in_RDI >> 0x20));
    execAddressError(in_RDI,frame,delay);
  }
  else {
    readA<(moira::Size)4>(in_RDI,in_stack_ffffffffffffffcc);
    push<(moira::Size)4,0ul>(in_RDI,in_stack_ffffffffffffffcc);
    writeA<(moira::Size)4>(in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    (in_RDI->reg).field_3.field_0.a[7] = (int)(short)uVar3 + (in_RDI->reg).field_3.field_0.a[7];
    prefetch<4ul>(in_RDI);
  }
  return;
}

Assistant:

void
Moira::execLink(u16 opcode)
{
    u16 ird  = getIRD();
    u32 sp   = getSP() - 4;
    
    int ax   = _____________xxx(opcode);
    i16 disp = (i16)readI<S>();

    // Check for address error
    if (misaligned<Long>(sp)) {
        writeA(ax, sp);
        execAddressError(makeFrame<AE_DATA|AE_WRITE>(sp, getPC() + 2, getSR(), ird));
        return;
    }
    
    // Write to stack
    push <Long> (readA(ax) - ((MIMIC_MUSASHI && ax == 7) ? 4 : 0));

    // Modify address register and stack pointer
    writeA(ax, sp);
    reg.sp += (i32)disp;

    prefetch<POLLIPL>();
}